

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorType.cpp
# Opt level: O0

string * __thiscall Kernel::OperatorType::argsToString_abi_cxx11_(OperatorType *this)

{
  long in_RSI;
  char *pcVar1;
  string *in_RDI;
  uint i;
  uint ar;
  string *res;
  TermList in_stack_ffffffffffffff80;
  string *this_00;
  allocator<char> *in_stack_ffffffffffffffb0;
  TermList *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  uint local_28;
  allocator<char> local_16;
  undefined1 local_15;
  uint local_14;
  
  this_00 = in_RDI;
  local_14 = arity((OperatorType *)in_stack_ffffffffffffff80._content);
  local_15 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<char>::~allocator(&local_16);
  for (local_28 = *(uint *)(in_RSI + 8); local_28 < local_14; local_28 = local_28 + 1) {
    in_stack_ffffffffffffff80 =
         arg((OperatorType *)this_00,(uint)(in_stack_ffffffffffffff80._content >> 0x20));
    TermList::toString_abi_cxx11_
              (in_stack_ffffffffffffffb8,SUB81(in_stack_ffffffffffffff80._content >> 0x38,0));
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffffb8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    if (local_28 != local_14 - 1) {
      std::__cxx11::string::operator+=((string *)in_RDI," * ");
    }
  }
  pcVar1 = "";
  if (1 < local_14) {
    pcVar1 = ")";
  }
  std::__cxx11::string::operator+=((string *)in_RDI,pcVar1);
  return this_00;
}

Assistant:

std::string OperatorType::argsToString() const
{
  unsigned ar = arity();
  ASS(ar);
  std::string res = ar > 1 ? "(" : "";
  for (unsigned i = _typeArgsArity; i < ar; i++) {
    res += arg(i).toString();
    if (i != ar-1) {
      res += " * ";
    }
  }
  res += ar > 1 ? ")" : "";
  return res;
}